

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O3

void sigfiddle_bang(t_sigfiddle *x)

{
  float f;
  t_peakout *ptVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  t_pitchhist *ptVar5;
  int npeakout;
  t_float *ptVar6;
  t_atom at [3];
  t_atom local_68;
  undefined4 local_58;
  t_float local_50;
  undefined4 local_48;
  t_float local_40;
  
  iVar2 = x->x_npeakout;
  if (0 < iVar2) {
    ptVar1 = x->x_peakbuf;
    lVar3 = 0;
    do {
      local_68.a_type = A_FLOAT;
      iVar4 = (int)(lVar3 + 1);
      local_68.a_w.w_float = (t_float)iVar4;
      local_58 = 1;
      local_50 = ptVar1[lVar3].po_freq;
      local_48 = 1;
      local_40 = ptVar1[lVar3].po_amp;
      outlet_list((_outlet *)x->x_peakout,(t_symbol *)0x0,3,&local_68);
      lVar3 = lVar3 + 1;
    } while (iVar2 != iVar4);
  }
  outlet_float((_outlet *)x->x_envout,x->x_dbs[x->x_histphase]);
  iVar2 = x->x_npitch;
  if (0 < iVar2) {
    ptVar6 = x->x_hist[0].h_pitches;
    iVar4 = 0;
    do {
      local_68.a_type = A_FLOAT;
      local_68.a_w.w_float = ptVar6[x->x_histphase];
      local_58 = 1;
      local_50 = ptVar6[(long)x->x_histphase + -0x14];
      outlet_list(*(_outlet **)(ptVar6 + 0x19),(t_symbol *)0x0,2,&local_68);
      iVar4 = iVar4 + 1;
      iVar2 = x->x_npitch;
      ptVar6 = ptVar6 + 0x30;
    } while (iVar4 < iVar2);
  }
  if (x->x_attackvalue != 0) {
    outlet_bang((_outlet *)x->x_attackout);
    iVar2 = x->x_npitch;
  }
  if (0 < iVar2) {
    ptVar5 = x->x_hist;
    iVar4 = 0;
    do {
      f = ptVar5->h_pitch;
      if ((f != 0.0) || (NAN(f))) {
        outlet_float((_outlet *)x->x_noteout,f);
        iVar2 = x->x_npitch;
      }
      iVar4 = iVar4 + 1;
      ptVar5 = ptVar5 + 1;
    } while (iVar4 < iVar2);
  }
  return;
}

Assistant:

void sigfiddle_bang(t_sigfiddle *x)
{
    int i;
    t_pitchhist *ph;
    if (x->x_npeakout)
    {
        int npeakout = x->x_npeakout;
        t_peakout *po;
        for (i = 0, po = x->x_peakbuf; i < npeakout; i++, po++)
        {
            t_atom at[3];
            SETFLOAT(at, i+1);
            SETFLOAT(at+1, po->po_freq);
            SETFLOAT(at+2, po->po_amp);
            outlet_list(x->x_peakout, 0, 3, at);
        }
    }
    outlet_float(x->x_envout, x->x_dbs[x->x_histphase]);
    for (i = 0,  ph = x->x_hist; i < x->x_npitch; i++,  ph++)
    {
        t_atom at[2];
        SETFLOAT(at, ph->h_pitches[x->x_histphase]);
        SETFLOAT(at+1, ph->h_amps[x->x_histphase]);
        outlet_list(ph->h_outlet, 0, 2, at);
    }
    if (x->x_attackvalue) outlet_bang(x->x_attackout);
    for (i = 0,  ph = x->x_hist; i < x->x_npitch; i++,  ph++)
        if (ph->h_pitch) outlet_float(x->x_noteout, ph->h_pitch);
}